

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O1

PolymorphicEmitInfo __thiscall
Wasm::WasmBytecodeGenerator::EmitCall<(Wasm::WasmOp)17>(WasmBytecodeGenerator *this)

{
  TypedRegisterAllocator *this_00;
  Type TVar1;
  IWasmByteCodeWriter *pIVar2;
  code *pcVar3;
  Type tmpReg;
  bool bVar4;
  bool bVar5;
  ArgSlot AVar6;
  uint16 uVar7;
  ArgSlot AVar8;
  BOOL BVar9;
  Local LVar10;
  uint uVar11;
  uint uVar12;
  RegSlot RVar13;
  RegSlot tmpReg_00;
  uint32 uVar14;
  EmitInfoBase EVar15;
  AsmJsRetType AVar16;
  WasmBinaryReader *pWVar17;
  undefined4 *puVar18;
  EmitInfo EVar19;
  EmitInfo EVar20;
  RegisterSpace *pRVar21;
  WasmRegisterSpace *pWVar22;
  WasmCompilationException *this_01;
  WasmBinaryReader *pWVar23;
  EmitInfo *pEVar24;
  ushort uVar25;
  ulong count;
  long lVar26;
  ulong uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  WasmType WVar31;
  ulong uVar32;
  PolymorphicEmitInfo PVar33;
  undefined1 local_88 [8];
  PolymorphicEmitInfo retInfo;
  EmitInfo local_70;
  EmitInfo indirectIndexInfo;
  EmitInfo *local_58;
  ushort local_3a;
  Type local_38;
  ArgSlot args;
  anon_class_1_0_00000001 argOverflow;
  
  local_70.super_EmitInfoBase.location = 0xffffffff;
  local_70.type = Void;
  pWVar17 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
  pWVar23 = pWVar17;
  if (pWVar17 == (WasmBinaryReader *)0x0) {
    pWVar23 = (this->m_module->m_reader).ptr;
  }
  local_38 = (pWVar23->super_WasmReaderBase).m_currentNode.field_1.call.funcType;
  if (local_38 != Import) {
    pWVar23 = pWVar17;
    if (pWVar17 == (WasmBinaryReader *)0x0) {
      pWVar23 = (this->m_module->m_reader).ptr;
    }
    if ((pWVar23->super_WasmReaderBase).m_currentNode.field_1.call.funcType != Function) {
      if (pWVar17 == (WasmBinaryReader *)0x0) {
        pWVar17 = (this->m_module->m_reader).ptr;
      }
      if ((pWVar17->super_WasmReaderBase).m_currentNode.field_1.call.funcType != ImportThunk) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar18 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar18 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                           ,0x449,
                           "(isImportCall || GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::Function || GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::ImportThunk)"
                           ,
                           "isImportCall || GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::Function || GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::ImportThunk"
                          );
        if (!bVar4) goto LAB_00f37d01;
        *puVar18 = 0;
      }
    }
  }
  local_70 = PopEvalStack(this,FirstLocalType,L"Indirect call index must be int type");
  pWVar17 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
  if (pWVar17 == (WasmBinaryReader *)0x0) {
    pWVar17 = (this->m_module->m_reader).ptr;
  }
  EVar19 = (EmitInfo)
           Js::WebAssemblyModule::GetSignature
                     (this->m_module,
                      (pWVar17->super_WasmReaderBase).m_currentNode.field_1.brTable.numTargets);
  if (local_38 == Import) {
    AVar6 = WasmSignature::GetParamCount((WasmSignature *)EVar19);
    uVar7 = UInt16Math::
            Mul<Wasm::WasmBytecodeGenerator::EmitCall<(Wasm::WasmOp)17>()::_lambda()_1_const>
                      (AVar6,8,(anon_class_1_0_00000001 *)((long)&args + 1));
    uVar25 = 0x11;
  }
  else {
    uVar7 = WasmSignature::GetParamsSize((WasmSignature *)EVar19);
    uVar25 = 0x1c;
  }
  uVar7 = UInt16Math::
          Add<Wasm::WasmBytecodeGenerator::EmitCall<(Wasm::WasmOp)17>()::_lambda()_1_const>
                    (uVar7,8,(anon_class_1_0_00000001 *)((long)&args + 1));
  if ((uVar7 & 7) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar18 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar18 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                       ,0x478,"((0))","Wasm argument size should always be Var aligned");
    if (!bVar4) {
LAB_00f37d01:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar18 = 0;
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException(this_01,L"Internal Error");
    goto LAB_00f37c78;
  }
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x1f])(this->m_writer,(ulong)uVar25,(ulong)uVar7,0);
  AVar6 = WasmSignature::GetParamCount((WasmSignature *)EVar19);
  retInfo.field_1.infos = (EmitInfo *)&this->m_alloc;
  count = (ulong)AVar6;
  if (AVar6 == 0) {
    local_58 = (EmitInfo *)&DAT_00000008;
  }
  else {
    BVar9 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar9 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar18 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar18 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar4) goto LAB_00f37d01;
      *puVar18 = 0;
    }
    local_58 = (EmitInfo *)
               Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               AllocInternal(retInfo.field_1.infos,(ulong)((uint)AVar6 * 8));
    if (local_58 == (EmitInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar18 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar18 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar4) goto LAB_00f37d01;
      *puVar18 = 0;
    }
    pEVar24 = local_58;
    do {
      pEVar24->super_EmitInfoBase = 0xffffffff;
      pEVar24->type = Void;
      pEVar24 = pEVar24 + 1;
    } while (pEVar24 != local_58 + count);
  }
  if (count != 0) {
    lVar26 = count + 1;
    do {
      LVar10 = WasmSignature::GetParam((WasmSignature *)EVar19,(short)lVar26 - 2);
      EVar20 = PopEvalStack(this,LVar10,L"Call argument does not match formal type");
      local_58[lVar26 + -2] = EVar20;
      lVar26 = lVar26 + -1;
    } while (1 < lVar26);
    puVar18 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    bVar4 = local_38 == Import;
    uVar28 = 0x21;
    if (bVar4) {
      uVar28 = 0x15;
    }
    uVar29 = 0x20;
    if (bVar4) {
      uVar29 = 0x14;
    }
    uVar30 = 0x22;
    if (bVar4) {
      uVar30 = 0x16;
    }
    uVar32 = 1;
    uVar27 = 0;
    indirectIndexInfo = EVar19;
    do {
      WVar31 = local_58[uVar27].type;
      if (7 < WVar31 - FirstLocalType) {
switchD_00f376a6_caseD_6:
        WasmTypes::
        CompileAssertCasesNoFailFast<(Wasm::WasmTypes::WasmType)1,(Wasm::WasmTypes::WasmType)2,(Wasm::WasmTypes::WasmType)3,(Wasm::WasmTypes::WasmType)4,(Wasm::WasmTypes::WasmType)5>
                  ();
        this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
        WasmCompilationException::WasmCompilationException
                  (this_01,L"Unknown argument type %u",(ulong)WVar31);
        goto LAB_00f37c78;
      }
      uVar12 = local_58[uVar27].super_EmitInfoBase.location;
      uVar11 = uVar30;
      switch(WVar31) {
      case FirstLocalType:
        uVar11 = uVar29;
        break;
      case I64:
        uVar11 = uVar28;
        break;
      case F32:
        break;
      case F64:
        uVar11 = (uint)!bVar4 * 8 + 0x17;
        break;
      case V128:
        Simd::EnsureSimdIsEnabled();
        uVar11 = bVar4 ^ 0x145;
        break;
      default:
        goto switchD_00f376a6_caseD_6;
      case Any:
        if (this->isUnreachable == false) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar18 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                             ,0x4a6,"(IsUnreachable())","IsUnreachable()");
          if (!bVar5) goto LAB_00f37d01;
          *puVar18 = 0;
          EVar19 = indirectIndexInfo;
        }
        uVar11 = 0x14;
        if (this->isUnreachable == false) goto switchD_00f376a6_caseD_6;
      }
      (*this->m_writer->_vptr_IWasmByteCodeWriter[0xf])
                (this->m_writer,(ulong)uVar11,uVar32,(ulong)uVar12);
      uVar12 = 1;
      if (local_38 != Import) {
        AVar8 = WasmSignature::GetParamSize((WasmSignature *)EVar19,(ArgSlot)uVar27);
        if ((AVar8 & 7) != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar18 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                             ,0x4bc,
                             "(Math::IsAligned<Js::ArgSlot>(currentArgSize, sizeof(Js::Var)))",
                             "Math::IsAligned<Js::ArgSlot>(currentArgSize, sizeof(Js::Var))");
          if (!bVar5) goto LAB_00f37d01;
          *puVar18 = 0;
          EVar19 = indirectIndexInfo;
        }
        uVar12 = (uint)(AVar8 >> 3);
      }
      uVar32 = (ulong)((int)uVar32 + uVar12);
      uVar27 = uVar27 + 1;
    } while (count != uVar27);
  }
  this_00 = &this->mTypedRegisterAllocator;
  pRVar21 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_00,INT64);
  RVar13 = WAsmJs::RegisterSpace::AcquireTmpRegister(pRVar21);
  pRVar21 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_00,INT64);
  tmpReg_00 = WAsmJs::RegisterSpace::AcquireTmpRegister(pRVar21);
  pIVar2 = this->m_writer;
  TVar1 = this->m_module->m_importedFunctionCount;
  uVar14 = Js::WebAssemblyModule::GetWasmFunctionCount(this->m_module);
  (*pIVar2->_vptr_IWasmByteCodeWriter[0x18])
            (pIVar2,0x4d,(ulong)tmpReg_00,1,(ulong)(TVar1 + uVar14 + 1));
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x18])
            (this->m_writer,0x58,(ulong)RVar13,(ulong)tmpReg_00,(ulong)local_70 & 0xffffffff);
  pRVar21 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_00,INT64);
  WAsmJs::RegisterSpace::ReleaseTmpRegister(pRVar21,tmpReg_00);
  pIVar2 = this->m_writer;
  uVar14 = WasmSignature::GetSignatureId((WasmSignature *)EVar19);
  (*pIVar2->_vptr_IWasmByteCodeWriter[9])(pIVar2,0x59,(ulong)RVar13,(ulong)uVar14);
  local_88._0_4_ = 0;
  retInfo.count = 0;
  retInfo._4_4_ = 0;
  PolymorphicEmitInfo::Init
            ((PolymorphicEmitInfo *)local_88,*(Type *)((long)EVar19 + 4),
             (ArenaAllocator *)retInfo.field_1.infos);
  if (*(Type *)((long)EVar19 + 4) != 0) {
    uVar14 = 0;
    do {
      LVar10 = WasmSignature::GetResult((WasmSignature *)EVar19,uVar14);
      PolymorphicEmitInfo::SetInfo
                ((PolymorphicEmitInfo *)local_88,(EmitInfo)(((ulong)LVar10 << 0x20) + 0xffffffff),
                 uVar14);
      uVar14 = uVar14 + 1;
    } while (uVar14 < *(Type *)((long)EVar19 + 4));
  }
  if (local_38 != Import) {
    pRVar21 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_00,INT64);
    WAsmJs::RegisterSpace::ReleaseTmpRegister(pRVar21,RVar13);
    ReleaseLocation(this,&local_70);
    if (count != 0) {
      uVar27 = (ulong)((uint)AVar6 * 8);
      do {
        ReleaseLocation(this,(EmitInfo *)((long)&local_58[-1].super_EmitInfoBase.location + uVar27))
        ;
        uVar27 = uVar27 - 8;
      } while (uVar27 != 0);
    }
    if (*(Type *)((long)EVar19 + 4) != 0) {
      uVar14 = 0;
      do {
        LVar10 = WasmSignature::GetResult((WasmSignature *)EVar19,uVar14);
        pWVar22 = GetRegisterSpace(this,LVar10);
        EVar15.location = WAsmJs::RegisterSpace::AcquireTmpRegister(pWVar22);
        EVar20.type = LVar10;
        EVar20.super_EmitInfoBase.location = EVar15.location;
        PolymorphicEmitInfo::SetInfo((PolymorphicEmitInfo *)local_88,EVar20,uVar14);
        uVar14 = uVar14 + 1;
      } while (uVar14 < *(Type *)((long)EVar19 + 4));
    }
    if (local_88._0_4_ == 0) {
      WVar31 = Void;
      EVar19.super_EmitInfoBase.location = 0xffffffff;
      EVar19.type = Void;
    }
    else {
      EVar19 = PolymorphicEmitInfo::GetInfo((PolymorphicEmitInfo *)local_88,0);
      WVar31 = EVar19.type;
    }
    pIVar2 = this->m_writer;
    local_3a = uVar7 >> 3;
    AVar16 = WasmToAsmJs::GetAsmJsReturnType(WVar31);
    (*pIVar2->_vptr_IWasmByteCodeWriter[0x20])
              (pIVar2,0x1d,(ulong)EVar19 & 0xffffffff,(ulong)RVar13,(ulong)(uVar7 >> 3),
               (ulong)AVar16.which_,0xffff);
    goto LAB_00f37c16;
  }
  local_3a = WasmSignature::GetParamCount((WasmSignature *)EVar19);
  UInt16Math::Inc<Wasm::WasmBytecodeGenerator::EmitCall<(Wasm::WasmOp)17>()::_lambda()_1_const>
            (&local_3a,(anon_class_1_0_00000001 *)((long)&args + 1));
  pRVar21 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_00,INT64);
  local_38 = WAsmJs::RegisterSpace::AcquireTmpRegister(pRVar21);
  if (1 < *(Type *)((long)EVar19 + 4)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar18 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar18 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                       ,0x4e8,"(calleeSignature->GetResultCount() <= 1)",
                       "Multiple results from function imports not supported");
    if (!bVar4) goto LAB_00f37d01;
    *puVar18 = 0;
  }
  if (*(Type *)((long)EVar19 + 4) == 0) {
    indirectIndexInfo.super_EmitInfoBase.location = 0;
    indirectIndexInfo.type = Void;
  }
  else {
    LVar10 = WasmSignature::GetResult((WasmSignature *)EVar19,0);
    indirectIndexInfo.type = Void;
    indirectIndexInfo.super_EmitInfoBase.location = LVar10;
  }
  pIVar2 = this->m_writer;
  uVar27 = (ulong)local_3a;
  AVar16 = WasmToAsmJs::GetAsmJsReturnType(indirectIndexInfo.super_EmitInfoBase.location.location);
  tmpReg = local_38;
  (*pIVar2->_vptr_IWasmByteCodeWriter[0x20])
            (pIVar2,0x12,(ulong)(uint)local_38,(ulong)RVar13,uVar27,(ulong)AVar16.which_,0xffff);
  pRVar21 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_00,INT64);
  WAsmJs::RegisterSpace::ReleaseTmpRegister(pRVar21,tmpReg);
  pRVar21 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_00,INT64);
  WAsmJs::RegisterSpace::ReleaseTmpRegister(pRVar21,RVar13);
  ReleaseLocation(this,&local_70);
  if (count != 0) {
    uVar27 = (ulong)((uint)AVar6 * 8);
    do {
      ReleaseLocation(this,(EmitInfo *)((long)&local_58[-1].super_EmitInfoBase.location + uVar27));
      uVar27 = uVar27 - 8;
    } while (uVar27 != 0);
  }
  EVar20 = indirectIndexInfo;
  if (*(Type *)((long)EVar19 + 4) == 0) goto LAB_00f37c16;
  switch(indirectIndexInfo.super_EmitInfoBase.location.location) {
  case 1:
    uVar25 = 0x18;
    break;
  case 2:
    uVar25 = 0x1b;
    break;
  case 3:
    uVar25 = 0x19;
    break;
  case 4:
    uVar25 = 0x1a;
    break;
  case 5:
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Return type: v128 not supported in import calls");
    goto LAB_00f37c78;
  default:
    WasmTypes::
    CompileAssertCasesNoFailFast<(Wasm::WasmTypes::WasmType)1,(Wasm::WasmTypes::WasmType)2,(Wasm::WasmTypes::WasmType)3,(Wasm::WasmTypes::WasmType)4,(Wasm::WasmTypes::WasmType)5>
              ();
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,L"Unknown call return type %u",(ulong)EVar20 & 0xffffffff);
LAB_00f37c78:
    __cxa_throw(this_01,&WasmCompilationException::typeinfo,
                WasmCompilationException::~WasmCompilationException);
  }
  pWVar22 = GetRegisterSpace(this,indirectIndexInfo.super_EmitInfoBase.location.location);
  RVar13 = WAsmJs::RegisterSpace::AcquireTmpRegister(pWVar22);
  PolymorphicEmitInfo::SetInfo
            ((PolymorphicEmitInfo *)local_88,(EmitInfo)((ulong)RVar13 | (long)EVar20 << 0x20),0);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0xf])
            (this->m_writer,(ulong)uVar25,(ulong)RVar13,(ulong)(uint)local_38);
LAB_00f37c16:
  Memory::DeleteArray<Memory::ArenaAllocator,Wasm::EmitInfo>
            ((AllocatorType *)retInfo.field_1.infos,count,local_58);
  if (this->m_maxArgOutDepth <= (uint)local_3a) {
    this->m_maxArgOutDepth = local_3a + 1;
  }
  PVar33._4_4_ = 0;
  PVar33.count = local_88._0_4_;
  PVar33.field_1 = (anon_union_8_2_2e7736b0_for_PolymorphicEmitInfo_1)retInfo._0_8_;
  return PVar33;
}

Assistant:

PolymorphicEmitInfo WasmBytecodeGenerator::EmitCall()
{
    uint32 funcNum = Js::Constants::UninitializedValue;
    uint32 signatureId = Js::Constants::UninitializedValue;
    WasmSignature* calleeSignature = nullptr;
    Js::ProfileId profileId = Js::Constants::NoProfileId;
    EmitInfo indirectIndexInfo;
    const bool isImportCall = GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::Import;
    Assert(isImportCall || GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::Function || GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::ImportThunk);
    switch (wasmOp)
    {
    case wbCall:
    {
        funcNum = GetReader()->m_currentNode.call.num;
        WasmFunctionInfo* calleeInfo = m_module->GetWasmFunctionInfo(funcNum);
        calleeSignature = calleeInfo->GetSignature();
        // currently only handle inlining internal function calls
        // in future we can expand to all calls by adding checks in inliner and falling back to call in case ScriptFunction doesn't match
        if (GetReader()->m_currentNode.call.funcType == FunctionIndexTypes::Function && !PHASE_TRACE1(Js::WasmInOutPhase))
        {
            profileId = GetNextProfileId();
        }
        break;
    }
    case wbCallIndirect:
        indirectIndexInfo = PopEvalStack(WasmTypes::I32, _u("Indirect call index must be int type"));
        signatureId = GetReader()->m_currentNode.call.num;
        calleeSignature = m_module->GetSignature(signatureId);
        break;
    default:
        Assume(UNREACHED);
    }

    const auto argOverflow = []
    {
        throw WasmCompilationException(_u("Argument size too big"));
    };

    // emit start call
    Js::ArgSlot argSize;
    Js::OpCodeAsmJs startCallOp;
    if (isImportCall)
    {
        argSize = ArgSlotMath::Mul(calleeSignature->GetParamCount(), sizeof(Js::Var), argOverflow);
        startCallOp = Js::OpCodeAsmJs::StartCall;
    }
    else
    {
        startCallOp = Js::OpCodeAsmJs::I_StartCall;
        argSize = calleeSignature->GetParamsSize();
    }
    // Add return value
    argSize = ArgSlotMath::Add(argSize, sizeof(Js::Var), argOverflow);
    if (!Math::IsAligned<Js::ArgSlot>(argSize, sizeof(Js::Var)))
    {
        AssertMsg(UNREACHED, "Wasm argument size should always be Var aligned");
        throw WasmCompilationException(_u("Internal Error"));
    }

    m_writer->AsmStartCall(startCallOp, argSize);

    Js::ArgSlot nArgs = calleeSignature->GetParamCount();

    // copy args into a list so they could be generated in the right order (FIFO)
    EmitInfo* argsList = AnewArray(&m_alloc, EmitInfo, nArgs);
    for (int i = int(nArgs) - 1; i >= 0; --i)
    {
        EmitInfo info = PopEvalStack(calleeSignature->GetParam((Js::ArgSlot)i), _u("Call argument does not match formal type"));
        // We can release the location of the arguments now, because we won't create new temps between start/call
        argsList[i] = info;
    }

    // Skip the this pointer (aka undefined)
    uint32 argLoc = 1;
    for (Js::ArgSlot i = 0; i < nArgs; ++i)
    {
        EmitInfo info = argsList[i];

        Js::OpCodeAsmJs argOp = Js::OpCodeAsmJs::Nop;
        switch (info.type)
        {
        case WasmTypes::F32:
            argOp = isImportCall ? Js::OpCodeAsmJs::ArgOut_Flt : Js::OpCodeAsmJs::I_ArgOut_Flt;
            break;
        case WasmTypes::F64:
            argOp = isImportCall ? Js::OpCodeAsmJs::ArgOut_Db : Js::OpCodeAsmJs::I_ArgOut_Db;
            break;
        case WasmTypes::I32:
            argOp = isImportCall ? Js::OpCodeAsmJs::ArgOut_Int : Js::OpCodeAsmJs::I_ArgOut_Int;
            break;
        case WasmTypes::I64:
            argOp = isImportCall ? Js::OpCodeAsmJs::ArgOut_Long : Js::OpCodeAsmJs::I_ArgOut_Long;
            break;
#ifdef ENABLE_WASM_SIMD
        case WasmTypes::V128:
            Simd::EnsureSimdIsEnabled();
            argOp = isImportCall ? Js::OpCodeAsmJs::Simd128_ArgOut_F4 : Js::OpCodeAsmJs::Simd128_I_ArgOut_F4;
            break;
#endif
        case WasmTypes::Any:
            // In unreachable mode allow any type as argument since we won't actually emit the call
            Assert(IsUnreachable());
            if (IsUnreachable())
            {
                argOp = Js::OpCodeAsmJs::ArgOut_Int;
                break;
            }
            // Fall through
        default:
            WasmTypes::CompileAssertCasesNoFailFast<WasmTypes::I32, WasmTypes::I64, WasmTypes::F32, WasmTypes::F64, WASM_V128_CHECK_TYPE>();
            throw WasmCompilationException(_u("Unknown argument type %u"), info.type);
        }

        m_writer->AsmReg2(argOp, argLoc, info.location);

        // Calculated next argument Js::Var location
        if (isImportCall)
        {
            ++argLoc;
        }
        else
        {
            const Js::ArgSlot currentArgSize = calleeSignature->GetParamSize(i);
            Assert(Math::IsAligned<Js::ArgSlot>(currentArgSize, sizeof(Js::Var)));
            argLoc += currentArgSize / sizeof(Js::Var);
        }
    }

    Js::RegSlot funcReg = GetRegisterSpace(WasmTypes::Ptr)->AcquireTmpRegister();

    // emit call
    switch (wasmOp)
    {
    case wbCall:
    {
        uint32 offset = isImportCall ? m_module->GetImportFuncOffset() : m_module->GetFuncOffset();
        uint32 index = UInt32Math::Add(offset, funcNum);
        m_writer->AsmSlot(Js::OpCodeAsmJs::LdSlot, funcReg, Js::AsmJsFunctionMemory::ModuleEnvRegister, index);
        break;
    }
    case wbCallIndirect:
    {
        Js::RegSlot slotReg = GetRegisterSpace(WasmTypes::Ptr)->AcquireTmpRegister();
        m_writer->AsmSlot(Js::OpCodeAsmJs::LdSlotArr, slotReg, Js::AsmJsFunctionMemory::ModuleEnvRegister, m_module->GetTableEnvironmentOffset());
        m_writer->AsmSlot(Js::OpCodeAsmJs::LdArr_WasmFunc, funcReg, slotReg, indirectIndexInfo.location);
        GetRegisterSpace(WasmTypes::Ptr)->ReleaseTmpRegister(slotReg);
        m_writer->AsmReg1IntConst1(Js::OpCodeAsmJs::CheckSignature, funcReg, calleeSignature->GetSignatureId());
        break;
    }
    default:
        Assume(UNREACHED);
    }

    // calculate number of RegSlots(Js::Var) the call consumes
    PolymorphicEmitInfo retInfo;
    retInfo.Init(calleeSignature->GetResultCount(), &m_alloc);
    for (uint32 i = 0; i < calleeSignature->GetResultCount(); ++i)
    {
        retInfo.SetInfo(EmitInfo(calleeSignature->GetResult(i)), i);
    }
    Js::ArgSlot args;
    if (isImportCall)
    {
        args = calleeSignature->GetParamCount();
        ArgSlotMath::Inc(args, argOverflow);

        Js::RegSlot varRetReg = GetRegisterSpace(WasmTypes::Ptr)->AcquireTmpRegister();
        AssertOrFailFastMsg(calleeSignature->GetResultCount() <= 1, "Multiple results from function imports not supported");
        WasmTypes::WasmType singleResType = calleeSignature->GetResultCount() > 0 ? calleeSignature->GetResult(0) : WasmTypes::Void;
        m_writer->AsmCall(Js::OpCodeAsmJs::Call, varRetReg, funcReg, args, WasmToAsmJs::GetAsmJsReturnType(singleResType), profileId);

        GetRegisterSpace(WasmTypes::Ptr)->ReleaseTmpRegister(varRetReg);
        GetRegisterSpace(WasmTypes::Ptr)->ReleaseTmpRegister(funcReg);

        ReleaseLocation(&indirectIndexInfo);
        //registers need to be released from higher ordinals to lower
        for (uint32 i = nArgs; i > 0; --i)
        {
            ReleaseLocation(&(argsList[i - 1]));
        }

        // emit result coercion
        if (calleeSignature->GetResultCount() > 0)
        {
            Js::OpCodeAsmJs convertOp = Js::OpCodeAsmJs::Nop;
            switch (singleResType)
            {
            case WasmTypes::F32:
                convertOp = Js::OpCodeAsmJs::Conv_VTF;
                break;
            case WasmTypes::F64:
                convertOp = Js::OpCodeAsmJs::Conv_VTD;
                break;
            case WasmTypes::I32:
                convertOp = Js::OpCodeAsmJs::Conv_VTI;
                break;
            case WasmTypes::I64:
                convertOp = Js::OpCodeAsmJs::Conv_VTL;
                break;
#ifdef ENABLE_WASM_SIMD
            case WasmTypes::V128:
                throw WasmCompilationException(_u("Return type: v128 not supported in import calls"));
#endif
            default:
                WasmTypes::CompileAssertCasesNoFailFast<WasmTypes::I32, WasmTypes::I64, WasmTypes::F32, WasmTypes::F64, WASM_V128_CHECK_TYPE>();
                throw WasmCompilationException(_u("Unknown call return type %u"), singleResType);
            }
            Js::RegSlot location = GetRegisterSpace(singleResType)->AcquireTmpRegister();
            retInfo.SetInfo(EmitInfo(location, singleResType), 0);
            m_writer->AsmReg2(convertOp, location, varRetReg);
        }
    }
    else
    {
        GetRegisterSpace(WasmTypes::Ptr)->ReleaseTmpRegister(funcReg);
        ReleaseLocation(&indirectIndexInfo);
        //registers need to be released from higher ordinals to lower
        for (uint32 i = nArgs; i > 0; --i)
        {
            ReleaseLocation(&(argsList[i - 1]));
        }

        for (uint32 i = 0; i < calleeSignature->GetResultCount(); ++i)
        {
            EmitInfo info(calleeSignature->GetResult(i));
            info.location = GetRegisterSpace(info.type)->AcquireTmpRegister();
            retInfo.SetInfo(info, i);
        }

        EmitInfo singleResultInfo = retInfo.Count() > 0 ? retInfo.GetInfo(0) : EmitInfo(WasmTypes::Void);
        args = (Js::ArgSlot)(::ceil((double)(argSize / sizeof(Js::Var))));
        // todo:: add bytecode to call and set aside multi results
        m_writer->AsmCall(Js::OpCodeAsmJs::I_Call, singleResultInfo.location, funcReg, args, WasmToAsmJs::GetAsmJsReturnType(singleResultInfo.type), profileId);
    }
    AdeleteArray(&m_alloc, nArgs, argsList);

    // WebAssemblyArrayBuffer is not detachable, no need to check for detached state here

    // track stack requirements for out params

    // + 1 for return address
    uint32 maxDepthForLevel = args + 1;
    if (maxDepthForLevel > m_maxArgOutDepth)
    {
        m_maxArgOutDepth = maxDepthForLevel;
    }

    return retInfo;
}